

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void duckdb_fmt::v6::internal::
     convert_arg<long,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>,char>
               (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                *arg,char type)

{
  byte bVar1;
  bool bVar2;
  type tVar3;
  ulong uVar4;
  
  switch(arg->type_) {
  case int_type:
    if ((type == 'i') || (tVar3 = uint_type, type == 'd')) {
      uVar4 = (ulong)(arg->value_).field_0.int_value;
      goto LAB_01408ab4;
    }
    break;
  case uint_type:
    if ((type == 'i') || (tVar3 = uint_type, type == 'd')) {
      uVar4 = (ulong)(arg->value_).field_0.uint_value;
      goto LAB_01408ab4;
    }
    break;
  case long_long_type:
  case ulong_long_type:
    tVar3 = (type == 'd' || type == 'i') ^ ulong_long_type;
    break;
  default:
    goto switchD_01408a37_caseD_6;
  case bool_type:
    bVar2 = (arg->value_).field_0.bool_value;
    uVar4 = (ulong)bVar2;
    if (type != 'd') {
      if (type == 's') {
        return;
      }
      if (type != 'i') {
        *(uint *)&(arg->value_).field_0 = (uint)bVar2;
        tVar3 = bool_type;
        break;
      }
    }
LAB_01408ab4:
    *(ulong *)&(arg->value_).field_0 = uVar4;
    tVar3 = long_long_type;
    break;
  case char_type:
    bVar1 = (arg->value_).field_0.char_value;
    uVar4 = (ulong)(char)bVar1;
    if ((type == 'i') || (type == 'd')) goto LAB_01408ab4;
    *(uint *)&(arg->value_).field_0 = (uint)bVar1;
    tVar3 = uint_type;
  }
  arg->type_ = tVar3;
switchD_01408a37_caseD_6:
  return;
}

Assistant:

FMT_CONSTEXPR auto visit_format_arg(Visitor&& vis,
                                    const basic_format_arg<Context>& arg)
    -> decltype(vis(0)) {
  using char_type = typename Context::char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
#if FMT_USE_INT128
  case internal::int128_type:
    return vis(arg.value_.int128_value);
  case internal::uint128_type:
    return vis(arg.value_.uint128_value);
#else
  case internal::int128_type:
  case internal::uint128_type:
    break;
#endif
  case internal::bool_type:
    return vis(arg.value_.bool_value);
  case internal::char_type:
    return vis(arg.value_.char_value);
  case internal::float_type:
    return vis(arg.value_.float_value);
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.data);
  case internal::string_type:
    return vis(basic_string_view<char_type>(arg.value_.string.data,
                                            arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}